

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsSerializeParserStateCore
          (byte *script,size_t cb,LoadScriptFlag loadScriptFlag,uchar *buffer,uint *bufferSize)

{
  anon_class_56_7_2b7be40b fn;
  JsErrorCode JVar1;
  undefined1 local_98 [8];
  CompileScriptException se;
  JavascriptFunction *function;
  uint *bufferSize_local;
  uchar *buffer_local;
  size_t sStack_18;
  LoadScriptFlag loadScriptFlag_local;
  size_t cb_local;
  byte *script_local;
  
  function = (JavascriptFunction *)bufferSize;
  bufferSize_local = (uint *)buffer;
  buffer_local._4_4_ = loadScriptFlag;
  sStack_18 = cb;
  cb_local = (size_t)script;
  CompileScriptException::CompileScriptException((CompileScriptException *)local_98);
  fn.bufferSize = (uint **)&function;
  fn.script = (byte **)&cb_local;
  fn.buffer = (uchar **)&bufferSize_local;
  fn.loadScriptFlag = (LoadScriptFlag *)((long)&buffer_local + 4);
  fn.cb = &stack0xffffffffffffffe8;
  fn.se = (CompileScriptException *)local_98;
  fn.function = (JavascriptFunction **)&se.bstrLine;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsSerializeParserStateCore::__0>(fn,false,false);
  CompileScriptException::~CompileScriptException((CompileScriptException *)local_98);
  return JVar1;
}

Assistant:

CHAKRA_API JsSerializeParserStateCore(
    _In_z_ const byte* script,
    _In_ size_t cb,
    _In_ LoadScriptFlag loadScriptFlag,
    _Out_writes_to_opt_(*bufferSize, *bufferSize) unsigned char *buffer,
    _Inout_ unsigned int *bufferSize)
{
    Js::JavascriptFunction *function;
    CompileScriptException se;

    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(script);
        PARAM_NOT_NULL(bufferSize);

        if (*bufferSize > 0)
        {
            PARAM_NOT_NULL(buffer);
            ZeroMemory(buffer, *bufferSize);
        }

        if (scriptContext->IsScriptContextInDebugMode())
        {
            return JsErrorCannotSerializeDebugScript;
        }

        SourceContextInfo * sourceContextInfo = scriptContext->GetSourceContextInfo(JS_SOURCE_CONTEXT_NONE, nullptr);
        Assert(sourceContextInfo != nullptr);
        sourceContextInfo->nextLocalFunctionId = 0;

        const int chsize = (loadScriptFlag & LoadScriptFlag_Utf8Source) ?
            sizeof(utf8char_t) : sizeof(WCHAR);

        SRCINFO si = {
            /* sourceContextInfo   */ sourceContextInfo,
            /* dlnHost             */ 0,
            /* ulColumnHost        */ 0,
            /* lnMinHost           */ 0,
            /* ichMinHost          */ 0,
            /* ichLimHost          */ static_cast<ULONG>(cb / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
            /* ulCharOffset        */ 0,
            /* mod                 */ kmodGlobal,
            /* grfsi               */ 0
        };

        Js::Utf8SourceInfo* sourceInfo = nullptr;
        loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_CreateParserState);

        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("ByteCodeSerializer"));
        // We cast buffer size to DWORD* because on Windows, DWORD = unsigned long = unsigned int
        // On 64-bit clang on linux, this is not true, unsigned long is larger than unsigned int
        // However, the PAL defines DWORD for us on linux as unsigned int so the cast is safe here.
        HRESULT hr = scriptContext->SerializeParserState(script, cb, &si, &se, &sourceInfo,
            Js::Constants::GlobalCode, loadScriptFlag, &buffer, (DWORD*)bufferSize, tempAllocator, &function, nullptr);
        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);

        if (function == nullptr)
        {
            HandleScriptCompileError(scriptContext, &se);
            return JsErrorScriptCompile;
        }

        Js::FunctionBody *functionBody = function->GetFunctionBody();
        sourceInfo = functionBody->GetUtf8SourceInfo();
        size_t cSourceCodeLength = sourceInfo->GetCbLength(_u("JsSerializeParserState"));

        // truncation of code length can lead to accessing random memory. Reject the call.
        if (cSourceCodeLength > DWORD_MAX)
        {
            return JsErrorOutOfMemory;
        }

        if (SUCCEEDED(hr))
        {
            return JsNoError;
        }
        else
        {
            return JsErrorScriptCompile;
        }
    });
}